

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O3

errr init_x11(wchar_t argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  long *plVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  infofnt *piVar8;
  _Bool _Var9;
  wchar_t wVar10;
  uint32_t uVar11;
  uint uVar12;
  int iVar13;
  wchar_t wVar14;
  errr eVar15;
  ang_file *paVar16;
  ushort **ppuVar17;
  Display *pDVar18;
  XkbDescPtr xkb;
  char *pcVar19;
  XFontSet p_Var20;
  long lVar21;
  infowin *piVar22;
  Window WVar23;
  XClassHint *pXVar24;
  __int32_t **pp_Var25;
  XSizeHints *pXVar26;
  byte *pbVar27;
  byte bVar28;
  term_data *t;
  uint8_t uVar29;
  int iVar30;
  ulong uVar31;
  infowin *iwin;
  char *pcVar32;
  uint8_t uVar33;
  wchar_t wVar34;
  Pixell PVar35;
  Pixell PVar36;
  wchar_t wVar37;
  infoclr **ppiVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  infofnt *ifnt;
  int local_a78;
  int local_a74;
  wchar_t local_a70;
  wchar_t local_a6c;
  wchar_t missing_count;
  char *local_a48;
  char **missing;
  uint b;
  uint h;
  uint w;
  ulong local_a28;
  undefined1 local_a1c [4];
  char res_class [20];
  char res_name [20];
  int local_99c;
  long local_990;
  char cmd [40];
  char local_938 [256];
  char buf [1024];
  char buf_1 [1024];
  
  if (argc < L'\x02') {
    pcVar32 = "";
  }
  else {
    wVar14 = L'\xffffffff';
    pcVar32 = "";
    uVar39 = 1;
    do {
      _Var9 = prefix(argv[uVar39],"-d");
      if (_Var9) {
        pcVar32 = argv[uVar39] + 2;
      }
      else {
        _Var9 = prefix(argv[uVar39],"-n");
        if (_Var9) {
          wVar10 = atoi(argv[uVar39] + 2);
          wVar14 = L'\b';
          if ((wVar10 < L'\t') && (wVar14 = wVar10, wVar10 < L'\x02')) {
            wVar14 = L'\x01';
          }
        }
        else {
          _Var9 = prefix(argv[uVar39],"-x");
          if (_Var9) {
            x11_prefs = argv[uVar39] + 2;
          }
          else {
            plog_fmt("Ignoring option: %s");
          }
        }
      }
      uVar39 = uVar39 + 1;
    } while ((uint)argc != uVar39);
    if (wVar14 != L'\xffffffff') goto LAB_00123b9b;
  }
  path_build(settings,0x400,ANGBAND_DIR_USER,"x11-settings.prf");
  wVar14 = L'\x01';
  paVar16 = file_open(settings,MODE_READ,FTYPE_TEXT);
  if (paVar16 != (ang_file *)0x0) {
    _Var9 = file_getl(paVar16,buf,0x400);
    wVar14 = L'\x01';
    if (_Var9) {
      do {
        uVar39 = (ulong)(byte)buf[0];
        if (((((uVar39 != 0) && (ppuVar17 = __ctype_b_loc(), uVar39 != 0x23)) &&
             (((*ppuVar17)[uVar39] & 0x2000) == 0)) &&
            ((_Var9 = prefix(buf,"TERM_WINS"), _Var9 &&
             (pcVar19 = strchr(buf,0x3d), pcVar19 != (char *)0x0)))) &&
           (wVar10 = atoi(pcVar19 + 1), L'\0' < wVar10)) {
          wVar14 = wVar10;
        }
        _Var9 = file_getl(paVar16,buf,0x400);
      } while (_Var9);
    }
    file_close(paVar16);
  }
LAB_00123b9b:
  pDVar18 = (Display *)XOpenDisplay(pcVar32);
  if (pDVar18 == (Display *)0x0) {
    eVar15 = -1;
  }
  else {
    metadpy_default_16 = metadpy_default_16 | 4;
    metadpy_default_1 = *(long *)(pDVar18 + 0xe8) + (long)*(int *)(pDVar18 + 0xe0) * 0x80;
    metadpy_default_2 =
         *(undefined8 *)(*(long *)(pDVar18 + 0xe8) + 0x10 + (long)*(int *)(pDVar18 + 0xe0) * 0x80);
    metadpy_default_4 = 8;
    metadpy_default_5 = 0x40;
    metadpy_default_0 = pDVar18;
    xkb = (XkbDescPtr)XkbGetKeyboard(pDVar18,0x7f,0x100);
    if (xkb != (XkbDescPtr)0x0) {
      metadpy_default_4 = xkb_mask_modifier(xkb,"Alt");
      metadpy_default_5 = xkb_mask_modifier(xkb,"Super");
      XkbFreeKeyboard(xkb,0,1);
    }
    metadpy_default_6 = *(undefined8 *)(pDVar18 + 0xd8);
    uVar41 = *(uint *)(metadpy_default_1 + 0x38);
    metadpy_default_13 = *(Pixell *)(metadpy_default_1 + 0x60);
    metadpy_default_14 = *(Pixell *)(metadpy_default_1 + 0x58);
    metadpy_default_15 = ~(-1L << ((byte)uVar41 & 0x3f));
    bVar28 = (uVar41 >= 2) * '\x02' | uVar41 < 2;
    uVar39 = (ulong)CONCAT31((int3)(uVar41 >> 8),bVar28);
    metadpy_default_16 = metadpy_default_16 & 0xfc | bVar28;
    term_windows_open = wVar14;
    xor = (infoclr *)mem_zalloc(0x20);
    PVar36 = metadpy_default_14;
    PVar35 = metadpy_default_13;
    Infoclr = xor;
    wVar10 = Infoclr_Opcode("xor");
    Infoclr_init_data(PVar36,PVar35,wVar10,(wchar_t)uVar39);
    ppiVar38 = clr;
    uVar40 = 0;
    do {
      Infoclr = (infoclr *)mem_zalloc(0x20);
      *ppiVar38 = Infoclr;
      uVar41 = (uint)uVar40 & 0x1f;
      uVar31 = (ulong)(uVar41 * 4);
      uVar29 = angband_color_table[0][uVar31 + 1];
      color_table_x11[0][uVar31] = angband_color_table[0][uVar31];
      color_table_x11[0][uVar31 + 1] = uVar29;
      uVar33 = angband_color_table[0][uVar31 + 2];
      uVar39 = CONCAT71((int7)(uVar39 >> 8),uVar33);
      color_table_x11[0][uVar31 + 2] = uVar33;
      bVar28 = angband_color_table[0][uVar31 + 3];
      color_table_x11[0][uVar31 + 3] = bVar28;
      PVar35 = metadpy_default_13;
      if ((metadpy_default_16 & 2) == 0) {
        PVar36 = metadpy_default_13;
        if (uVar40 != 0) {
          PVar36 = metadpy_default_14;
        }
        wVar10 = Infoclr_Opcode("cpy");
      }
      else {
        uVar39 = (ulong)bVar28;
        uVar11 = create_pixel(metadpy_default_0,uVar29,uVar33,bVar28);
        PVar36 = (Pixell)uVar11;
        uVar12 = (uint)(uVar40 >> 5) & 0x7ffffff;
        uVar29 = color_table_x11[0x1c][2];
        uVar33 = color_table_x11[0x1c][1];
        bVar28 = color_table_x11[0x1c][3];
        if (uVar12 == 2) {
LAB_00123de8:
          uVar39 = (ulong)bVar28;
          uVar11 = create_pixel(metadpy_default_0,uVar33,uVar29,bVar28);
          PVar35 = (ulong)uVar11;
        }
        else {
          PVar35 = metadpy_default_13;
          if (uVar12 == 1) {
            uVar29 = color_table_x11[uVar41][2];
            uVar33 = color_table_x11[uVar41][1];
            bVar28 = color_table_x11[uVar41][3];
            goto LAB_00123de8;
          }
        }
        wVar10 = Infoclr_Opcode("cpy");
      }
      Infoclr_init_data(PVar36,PVar35,wVar10,(wchar_t)uVar39);
      uVar40 = uVar40 + 1;
      ppiVar38 = ppiVar38 + 1;
    } while (uVar40 != 0x60);
    if (L'\0' < wVar14) {
      local_a28 = (ulong)(uint)wVar14;
      uVar39 = 0;
      do {
        strnfmt(buf_1,0x50,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
        pcVar32 = getenv(buf_1);
        if (((pcVar32 == (char *)0x0) &&
            (pcVar32 = getenv("ANGBAND_X11_FONT"), pcVar32 == (char *)0x0)) &&
           (pcVar32 = "9x15", uVar39 < 8)) {
          pcVar32 = (char *)((long)&DAT_00258284 + (long)(int)(&DAT_00258284)[uVar39]);
        }
        t = data + uVar39;
        local_a48 = pcVar32;
        paVar16 = file_open(settings,MODE_READ,FTYPE_TEXT);
        if (paVar16 == (ang_file *)0x0) {
          iVar7 = 1;
          local_a74 = 0;
          local_a6c = L'P';
          local_a70 = L'\x18';
          iVar6 = 1;
          local_a78 = 0;
        }
        else {
          _Var9 = file_getl(paVar16,buf_1,0x400);
          if (_Var9) {
            iVar6 = 1;
            local_a70 = L'\x18';
            local_a6c = L'P';
            local_a78 = 0;
            local_a74 = 0;
            iVar7 = 1;
            do {
              uVar40 = (ulong)(byte)buf_1[0];
              if (((uVar40 != 0) && (ppuVar17 = __ctype_b_loc(), uVar40 != 0x23)) &&
                 (((*ppuVar17)[uVar40] & 0x2000) == 0)) {
                strnfmt(cmd,0x28,"AT_X_%d",uVar39 & 0xffffffff);
                _Var9 = prefix(buf_1,cmd);
                if (_Var9) {
                  pcVar32 = strchr(buf_1,0x3d);
                  if (pcVar32 == (char *)0x0) {
                    local_a78 = -1;
                  }
                  else {
                    local_a78 = atoi(pcVar32 + 1);
                  }
                }
                else {
                  strnfmt(cmd,0x28,"AT_Y_%d",uVar39 & 0xffffffff);
                  _Var9 = prefix(buf_1,cmd);
                  if (_Var9) {
                    pcVar32 = strchr(buf_1,0x3d);
                    if (pcVar32 == (char *)0x0) {
                      local_a74 = -1;
                    }
                    else {
                      local_a74 = atoi(pcVar32 + 1);
                    }
                  }
                  else {
                    strnfmt(cmd,0x28,"COLS_%d",uVar39 & 0xffffffff);
                    _Var9 = prefix(buf_1,cmd);
                    if (_Var9) {
                      pcVar32 = strchr(buf_1,0x3d);
                      if ((pcVar32 != (char *)0x0) && (wVar14 = atoi(pcVar32 + 1), L'\0' < wVar14))
                      {
                        local_a6c = wVar14;
                      }
                    }
                    else {
                      strnfmt(cmd,0x28,"ROWS_%d",uVar39 & 0xffffffff);
                      _Var9 = prefix(buf_1,cmd);
                      if (_Var9) {
                        pcVar32 = strchr(buf_1,0x3d);
                        if ((pcVar32 != (char *)0x0) && (wVar14 = atoi(pcVar32 + 1), L'\0' < wVar14)
                           ) {
                          local_a70 = wVar14;
                        }
                      }
                      else {
                        strnfmt(cmd,0x28,"IBOX_%d",uVar39 & 0xffffffff);
                        _Var9 = prefix(buf_1,cmd);
                        if (_Var9) {
                          pcVar32 = strchr(buf_1,0x3d);
                          if ((pcVar32 != (char *)0x0) && (iVar13 = atoi(pcVar32 + 1), 0 < iVar13))
                          {
                            iVar6 = iVar13;
                          }
                        }
                        else {
                          strnfmt(cmd,0x28,"IBOY_%d",uVar39 & 0xffffffff);
                          _Var9 = prefix(buf_1,cmd);
                          if (_Var9) {
                            pcVar32 = strchr(buf_1,0x3d);
                            if ((pcVar32 != (char *)0x0) && (iVar13 = atoi(pcVar32 + 1), 0 < iVar13)
                               ) {
                              iVar7 = iVar13;
                            }
                          }
                          else {
                            strnfmt(cmd,0x28,"FONT_%d",uVar39 & 0xffffffff);
                            _Var9 = prefix(buf_1,cmd);
                            if (_Var9) {
                              pcVar32 = strchr(buf_1,0x3d);
                              if (pcVar32 != (char *)0x0) {
                                my_strcpy(local_938,pcVar32 + 1,0x100);
                                local_a48 = local_938;
                              }
                            }
                            else {
                              strnfmt(cmd,0x28,"TILE_WIDTH_%d",uVar39 & 0xffffffff);
                              _Var9 = prefix(buf_1,cmd);
                              if (_Var9) {
                                pcVar32 = strchr(buf_1,0x3d);
                                if ((pcVar32 != (char *)0x0) &&
                                   (wVar14 = atoi(pcVar32 + 1), L'\0' < wVar14)) {
                                  data[uVar39].tile_wid = wVar14;
                                }
                              }
                              else {
                                strnfmt(cmd,0x28,"TILE_HEIGHT_%d",uVar39 & 0xffffffff);
                                _Var9 = prefix(buf_1,cmd);
                                if (((_Var9) &&
                                    (pcVar32 = strchr(buf_1,0x3d), pcVar32 != (char *)0x0)) &&
                                   (wVar14 = atoi(pcVar32 + 1), L'\0' < wVar14)) {
                                  data[uVar39].tile_hgt = wVar14;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              _Var9 = file_getl(paVar16,buf_1,0x400);
            } while (_Var9);
          }
          else {
            local_a74 = 0;
            local_a6c = L'P';
            local_a70 = L'\x18';
            iVar7 = 1;
            iVar6 = 1;
            local_a78 = 0;
          }
          file_close(paVar16);
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_AT_X_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        pcVar32 = local_a48;
        if ((pcVar19 != (char *)0x0) && (iVar13 = atoi(pcVar19), 0 < iVar13)) {
          local_a78 = iVar13;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_AT_Y_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if ((pcVar19 != (char *)0x0) && (iVar13 = atoi(pcVar19), 0 < iVar13)) {
          local_a74 = iVar13;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_COLS_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if ((pcVar19 != (char *)0x0) && (wVar14 = atoi(pcVar19), L'\0' < wVar14)) {
          local_a6c = wVar14;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_ROWS_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if ((pcVar19 != (char *)0x0) && (wVar14 = atoi(pcVar19), L'\0' < wVar14)) {
          local_a70 = wVar14;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_IBOX_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if ((pcVar19 != (char *)0x0) && (iVar13 = atoi(pcVar19), 0 < iVar13)) {
          iVar6 = iVar13;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_IBOY_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if ((pcVar19 != (char *)0x0) && (iVar13 = atoi(pcVar19), 0 < iVar13)) {
          iVar7 = iVar13;
        }
        strnfmt(buf_1,0x400,"ANGBAND_X11_FONT_%d",uVar39 & 0xffffffff);
        pcVar19 = getenv(buf_1);
        if (pcVar19 != (char *)0x0) {
          pcVar32 = pcVar19;
        }
        if (uVar39 == 0) {
          if (local_a6c < L'Q') {
            local_a6c = L'P';
          }
          if (local_a70 < L'\x19') {
            local_a70 = L'\x18';
          }
        }
        Infofnt = (infofnt *)mem_zalloc(0x20);
        data[uVar39].fnt = Infofnt;
        if ((pcVar32 == (char *)0x0) ||
           (p_Var20 = (XFontSet)XCreateFontSet(metadpy_default_0,pcVar32,&missing,&missing_count,0),
           p_Var20 == (XFontSet)0x0)) {
          quit_fmt("Couldn\'t load the requested font. (%s)",pcVar32);
        }
        else {
          local_a48 = pcVar32;
          if (missing_count != L'\0') {
            XFreeStringList(missing);
          }
          piVar8 = Infofnt;
          Infofnt->name = (char *)0x0;
          piVar8->wid = 0;
          piVar8->twid = 0;
          piVar8->hgt = 0;
          piVar8->asc = 0;
          *(undefined8 *)&piVar8->off = 0;
          piVar8->fs = p_Var20;
          lVar21 = XExtentsOfFontSet(p_Var20);
          iVar13 = XFontsOfFontSet(p_Var20,res_name,res_class);
          piVar8->asc = 0;
          if (0 < iVar13) {
            iVar30 = 0;
            plVar3 = (long *)res_name._0_8_;
            do {
              res_name._0_8_ = plVar3 + 1;
              iVar1 = *(int *)(*plVar3 + 0x58);
              if ((short)iVar30 < iVar1) {
                piVar8->asc = (int16_t)iVar1;
                iVar30 = iVar1;
              }
              iVar13 = iVar13 + -1;
              plVar3 = (long *)res_name._0_8_;
            } while (iVar13 != 0);
          }
          uVar2 = *(undefined4 *)(lVar21 + 0xc);
          piVar8->wid = (int16_t)uVar2;
          piVar8->twid = (short)uVar2;
          piVar8->hgt = (short)((uint)uVar2 >> 0x10);
          pcVar32 = string_make(local_a48);
          piVar8 = Infofnt;
          Infofnt->name = pcVar32;
          piVar8->field_0x19 = piVar8->field_0x19 | 3;
        }
        wVar14 = data[uVar39].tile_wid;
        if (wVar14 < L'\x01') {
          wVar14 = (wchar_t)(data[uVar39].fnt)->twid;
          data[uVar39].tile_wid = wVar14;
        }
        wVar10 = data[uVar39].tile_hgt;
        if (wVar10 < L'\x01') {
          wVar10 = (wchar_t)(data[uVar39].fnt)->hgt;
          data[uVar39].tile_hgt = wVar10;
        }
        data[uVar39].tile_wid2 = wVar14;
        piVar22 = (infowin *)mem_zalloc(0x28);
        data[uVar39].win = piVar22;
        PVar36 = metadpy_default_14;
        PVar35 = metadpy_default_13;
        Infowin = piVar22;
        piVar22->win = 0;
        piVar22->mask = 0;
        piVar22->ox = 0;
        piVar22->oy = 0;
        piVar22->x = 0;
        piVar22->y = 0;
        piVar22->x_save = 0;
        piVar22->y_save = 0;
        piVar22->w = 0;
        piVar22->h = 0;
        piVar22->b = 0;
        piVar22->byte1 = '\0';
        *(undefined5 *)&piVar22->field_0x23 = 0;
        WVar23 = XCreateSimpleWindow(metadpy_default_0,metadpy_default_2,local_a78,local_a74,
                                     wVar14 * local_a6c + iVar6 * 2,wVar10 * local_a70 + iVar7 * 2,0
                                     ,PVar36,PVar35);
        XSelectInput(metadpy_default_0,WVar23,0);
        piVar22 = Infowin;
        Infowin->field_0x23 = Infowin->field_0x23 | 8;
        piVar22->win = WVar23;
        XGetGeometry(metadpy_default_0,WVar23,res_class,&missing,&missing_count,&w,&h,&b,local_a1c);
        piVar22->x = (int16_t)missing;
        piVar22->y = (int16_t)missing_count;
        piVar22->x_save = (int16_t)missing;
        piVar22->y_save = (int16_t)missing_count;
        piVar22->w = (int16_t)w;
        piVar22->h = (int16_t)h;
        piVar22->b = (uint16_t)b;
        XGetWindowAttributes(metadpy_default_0,WVar23,res_name);
        piVar22->mask = local_990;
        piVar22->field_0x23 = piVar22->field_0x23 & 0xfc | local_99c != 0 | 2;
        piVar22 = Infowin;
        Infowin->mask = 0x28005;
        XSelectInput(metadpy_default_0,piVar22->win,0x28005);
        missing = (char **)res_name;
        my_strcpy(res_name,angband_term_name[uVar39],0x80);
        iVar13 = XStringListToTextProperty(&missing,1,res_class);
        if (iVar13 != 0) {
          XSetWMName(metadpy_default_0,Infowin->win,res_class);
        }
        XFree(res_class._0_8_);
        piVar22 = Infowin;
        Infowin->ox = (int16_t)iVar6;
        piVar22->oy = (int16_t)iVar7;
        pXVar24 = (XClassHint *)XAllocClassHint();
        if (pXVar24 == (XClassHint *)0x0) {
          quit("XAllocClassHint failed");
        }
        my_strcpy(res_name,angband_term_name[uVar39],0x14);
        pp_Var25 = __ctype_tolower_loc();
        res_name[0] = (char)(*pp_Var25)[res_name._0_8_ & 0xff];
        pXVar24->res_name = res_name;
        my_strcpy(res_class,"Angband",0x14);
        pXVar24->res_class = res_class;
        XSetClassHint(metadpy_default_0,Infowin->win,pXVar24);
        pXVar26 = (XSizeHints *)XAllocSizeHints();
        if (pXVar26 == (XSizeHints *)0x0) {
          quit("XAllocSizeHints failed");
        }
        wVar14 = data[uVar39].tile_wid;
        if (uVar39 == 0) {
          wVar34 = wVar14 * 0x50;
          wVar10 = data[0].tile_hgt;
          wVar37 = wVar10 * 0x18;
        }
        else {
          wVar10 = data[uVar39].tile_hgt;
          wVar37 = wVar10;
          wVar34 = wVar14;
        }
        wVar4 = iVar6 * 2;
        wVar5 = iVar7 * 2;
        pXVar26->min_width = wVar34 + wVar4;
        pXVar26->min_height = wVar37 + wVar5;
        pXVar26->max_width = wVar14 * 0xff + wVar4;
        pXVar26->max_height = wVar10 * 0xff + wVar5;
        pXVar26->width_inc = wVar14;
        pXVar26->height_inc = wVar10;
        pXVar26->flags = (ulong)(local_a78 != 0 || local_a74 != 0) | 0x170;
        pXVar26->base_width = wVar4;
        pXVar26->base_height = wVar5;
        XSetWMNormalHints(metadpy_default_0,Infowin->win,pXVar26);
        pbVar27 = (byte *)XAllocWMHints();
        if (pbVar27 == (byte *)0x0) {
          quit("XAllocWMHints failed");
        }
        *pbVar27 = *pbVar27 | 0x40;
        *(Window *)(pbVar27 + 0x30) = (data[0].win)->win;
        XSetWMHints(metadpy_default_0,Infowin->win,pbVar27);
        XFree(pbVar27);
        XMapWindow(metadpy_default_0,Infowin->win);
        data[uVar39].sizeh = pXVar26;
        data[uVar39].classh = pXVar24;
        if ((-1 < local_a78) && (-1 < local_a74)) {
          XMoveWindow(metadpy_default_0,Infowin->win,local_a78,local_a74);
        }
        wVar14 = L'\x10';
        if (uVar39 == 0) {
          wVar14 = L'Ѐ';
        }
        term_init(&t->t,local_a6c,local_a70,wVar14);
        data[uVar39].t.soft_cursor = true;
        data[uVar39].t.complex_input = true;
        data[uVar39].t.xtra_hook = Term_xtra_x11;
        data[uVar39].t.curs_hook = Term_curs_x11;
        data[uVar39].t.bigcurs_hook = Term_bigcurs_x11;
        data[uVar39].t.wipe_hook = Term_wipe_x11;
        data[uVar39].t.text_hook = Term_text_x11;
        data[uVar39].t.data = t;
        Term_activate(&t->t);
        angband_term[uVar39] = Term;
        uVar39 = uVar39 + 1;
      } while (uVar39 != local_a28);
    }
    Infowin = data[0].win;
    XRaiseWindow(metadpy_default_0,(data[0].win)->win);
    Term_activate(&data[0].t);
    quit_aux = hook_quit;
    eVar15 = 0;
  }
  return eVar15;
}

Assistant:

errr init_x11(int argc, char **argv)
{
	int i;

	const char *dpy_name = "";

	int num_term = -1;

	ang_file *fff;

	char buf[1024];
	const char *str;
	int val;

	/* Parse args */
	for (i = 1; i < argc; i++) {
		if (prefix(argv[i], "-d"))
		{
			dpy_name = &argv[i][2];
			continue;
		}

		if (prefix(argv[i], "-n")) {
			num_term = atoi(&argv[i][2]);
			if (num_term > MAX_TERM_DATA) num_term = MAX_TERM_DATA;
			else if (num_term < 1) num_term = 1;
			continue;
		}

		if (prefix(argv[i], "-x")) {
			x11_prefs = argv[i] + 2;
			continue;
		}

		plog_fmt("Ignoring option: %s", argv[i]);
	}


	if (num_term == -1) {
		num_term = 1;

		/* Build the filename */
		(void)path_build(settings, sizeof(settings), ANGBAND_DIR_USER,
						 "x11-settings.prf");

		/* Open the file */
		fff = file_open(settings, MODE_READ, FTYPE_TEXT);

		/* File exists */
		if (fff) {
			/* Process the file */
			while (file_getl(fff, buf, sizeof(buf))) {
				/* Skip "empty" lines */
				if (!buf[0]) continue;
	
				/* Skip "blank" lines */
				if (isspace((unsigned char)buf[0])) continue;
	
				/* Skip comments */
				if (buf[0] == '#') continue;
	
				/* Number of terminal windows */
				if (prefix(buf, "TERM_WINS")) {
					str = strstr(buf, "=");
					val = (str != NULL) ? atoi(str + 1) : -1;
					if (val > 0) num_term = val;
					continue;
				}
			}
	
			/* Close */
			(void)file_close(fff);
		}
	}


	/* Init the Metadpy if possible */
	if (Metadpy_init_name(dpy_name)) return (-1);

	/* Remember the number of terminal windows */
	term_windows_open = num_term;

	/* Prepare cursor color */
	xor = mem_zalloc(sizeof(infoclr));
	Infoclr_set(xor);
	Infoclr_init_ppn(Metadpy->fg, Metadpy->bg, "xor", 0);


	/* Prepare normal colors */
	for (i = 0; i < MAX_COLORS * BG_MAX; ++i) {
		Pixell pixel;

		clr[i] = mem_zalloc(sizeof(infoclr));

		Infoclr_set(clr[i]);

		/* Acquire Angband colors */
		color_table_x11[i % MAX_COLORS][0] =
			angband_color_table[i % MAX_COLORS][0];
		color_table_x11[i % MAX_COLORS][1] =
			angband_color_table[i % MAX_COLORS][1];
		color_table_x11[i % MAX_COLORS][2] =
			angband_color_table[i % MAX_COLORS][2];
		color_table_x11[i % MAX_COLORS][3] =
			angband_color_table[i % MAX_COLORS][3];

		/* Default to monochrome */
		pixel = ((i == 0) ? Metadpy->bg : Metadpy->fg);

		/* Handle color 
		   This block of code has added support for background colours
                   (from Sil) */
		if (Metadpy->color) {
			Pixell backpixel;
			/* Create pixel */
			pixel = create_pixel(Metadpy->dpy,
					     color_table_x11[i % MAX_COLORS][1],
					     color_table_x11[i % MAX_COLORS][2],
					     color_table_x11[i % MAX_COLORS][3]);
			switch (i / MAX_COLORS)
			{
				case BG_BLACK:
					/* Default Background */
					Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
					break;
				case BG_SAME:
					/* Background same as foreground */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[i % MAX_COLORS][1],
											 color_table_x11[i % MAX_COLORS][2],
											 color_table_x11[i % MAX_COLORS][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
				case BG_DARK:
					/* Highlight Background */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[COLOUR_SHADE][1],
											 color_table_x11[COLOUR_SHADE][2],
											 color_table_x11[COLOUR_SHADE][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
			}
		} else {
			/* Handle monochrome */
		    Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
		}
	}


	/* Initialize the windows */
	for (i = 0; i < num_term; i++) {
		term_data *td = &data[i];

		/* Initialize the term_data */
		term_data_init(td, i);

		/* Save global entry */
		angband_term[i] = Term;
	}

	/* Raise the "Angband" window */
	Infowin_set(data[0].win);
	Infowin_raise();

	/* Activate the "Angband" window screen */
	Term_activate(&data[0].t);


	/* Activate hook */
	quit_aux = hook_quit;

	/* Success */
	return (0);
}